

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O1

GMM_STATUS
GmmTexGetMipMapOffset
          (GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo,GMM_LIB_CONTEXT *pGmmLibContext)

{
  uint uVar1;
  int iVar2;
  GMM_STATUS GVar3;
  GMM_TEXTURE_CALC *this;
  char cVar4;
  GMM_STATUS GVar5;
  
  GVar5 = GMM_ERROR;
  if (pReqInfo != (GMM_REQ_OFFSET_INFO *)0x0 && pTexInfo != (GMM_TEXTURE_INFO *)0x0) {
    this = GmmGetTextureCalc(pGmmLibContext);
    if (((pReqInfo->Plane < GMM_MAX_PLANE) && (pReqInfo->MipLevel < 0xf)) &&
       (pTexInfo->TileMode < GMM_TILE_MODES)) {
      uVar1 = *(uint *)pReqInfo;
      GVar5 = GMM_SUCCESS;
      cVar4 = '\0';
      if ((uVar1 & 2) != 0) {
        cVar4 = (char)(uVar1 & 1);
        if ((uVar1 & 1) != 0) {
          *(uint *)pReqInfo = uVar1 & 0xfffffffe;
        }
        iVar2 = (*this->_vptr_GmmTextureCalc[0xf])(this,pTexInfo,pReqInfo);
        GVar5 = (GMM_STATUS)(iVar2 != 0);
      }
      if (cVar4 != '\0') {
        *(byte *)pReqInfo = *(byte *)pReqInfo | 1;
      }
      uVar1 = *(uint *)pReqInfo;
      if ((uVar1 & 2) != 0) {
        *(uint *)pReqInfo = uVar1 & 0xfffffffd;
      }
      if ((undefined1  [96])((undefined1  [96])*pReqInfo & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) {
        GVar3 = GmmLib::GmmTextureCalc::GetTexRenderOffset(this,pTexInfo,pReqInfo);
        if (GVar3 != GMM_SUCCESS) {
          GVar5 = GMM_ERROR;
        }
      }
      if ((uVar1 & 2) != 0) {
        *(byte *)pReqInfo = *(byte *)pReqInfo | 2;
      }
      if ((undefined1  [96])((undefined1  [96])*pReqInfo & (undefined1  [96])0x4) !=
          (undefined1  [96])0x0) {
        GmmLib::GmmTextureCalc::GetTexStdLayoutOffset(this,pTexInfo,pReqInfo);
      }
    }
  }
  return GVar5;
}

Assistant:

GMM_STATUS GmmTexGetMipMapOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                 GMM_REQ_OFFSET_INFO *pReqInfo,
                                 GMM_LIB_CONTEXT *    pGmmLibContext)
{
    GMM_STATUS        Status           = GMM_SUCCESS;
    bool              RestoreRenderReq = false;
    bool              RestoreLockReq   = false;
    GMM_TEXTURE_CALC *pTextureCalc;

    GMM_DPF_ENTER;
    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);
    __GMM_ASSERT(pReqInfo->CubeFace <= __GMM_NO_CUBE_MAP);

    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(pTexInfo, pGmmLibContext);

    if((pReqInfo->Plane >= GMM_MAX_PLANE) ||
       (pReqInfo->Plane < GMM_NO_PLANE) ||
       (pReqInfo->MipLevel >= GMM_MAX_MIPMAP))
    {
        GMM_ASSERTDPF(0, "Invalid parameter!");
        return GMM_ERROR;
    }

    if((pTexInfo->TileMode >= GMM_TILE_MODES) ||
       (pTexInfo->TileMode < TILE_NONE))
    {
        GMM_ASSERTDPF(0, "Invalid parameter!");
        return GMM_ERROR;
    }

    // Retrieve offset info at pReqInfo->MipLevel
    if(pReqInfo->ReqLock)
    {
        if(pReqInfo->ReqRender)
        {
            pReqInfo->ReqRender = 0;
            RestoreRenderReq    = true;
        }

        if(pTextureCalc->GetTexLockOffset(pTexInfo, pReqInfo) != GMM_SUCCESS)
        {
            GMM_ASSERTDPF(0, "ReqLock failed!");
            Status = GMM_ERROR;
        }
    }

    if(RestoreRenderReq == true)
        pReqInfo->ReqRender = 1;

    if(pReqInfo->ReqLock)
    {
        pReqInfo->ReqLock = 0;
        RestoreLockReq    = 1;
    }

    if(pReqInfo->ReqRender)
    {
        if(pTextureCalc->GetTexRenderOffset(pTexInfo, pReqInfo) != GMM_SUCCESS)
        {
            GMM_ASSERTDPF(0, "ReqRender failed!");
            Status = GMM_ERROR;
        }
    }
    
    if(RestoreLockReq)
    {
        pReqInfo->ReqLock = 1;
    }
    
    if(pReqInfo->ReqStdLayout)
    {
        if(pTextureCalc->GetTexStdLayoutOffset(pTexInfo, pReqInfo) != GMM_SUCCESS)
        {
            GMM_ASSERTDPF(0, "ReqStdLayout failed!");
            Status = GMM_ERROR;
        }
    }

    GMM_DPF_EXIT;
    return Status;
}